

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void remove_expired(CookieInfo *cookies)

{
  Cookie *pCVar1;
  time_t tVar2;
  Cookie *local_38;
  Cookie *pv;
  uint i;
  curl_off_t now;
  Cookie *nx;
  Cookie *co;
  CookieInfo *cookies_local;
  
  tVar2 = time((time_t *)0x0);
  for (pv._4_4_ = 0; pv._4_4_ < 0x100; pv._4_4_ = pv._4_4_ + 1) {
    local_38 = (Cookie *)0x0;
    nx = cookies->cookies[pv._4_4_];
    while (nx != (Cookie *)0x0) {
      pCVar1 = nx->next;
      if ((nx->expires == 0) || (tVar2 <= nx->expires)) {
        local_38 = nx;
        nx = pCVar1;
      }
      else {
        if (local_38 == (Cookie *)0x0) {
          cookies->cookies[pv._4_4_] = nx->next;
        }
        else {
          local_38->next = nx->next;
        }
        cookies->numcookies = cookies->numcookies + -1;
        freecookie(nx);
        nx = pCVar1;
      }
    }
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Cookie *pv = NULL;
    co = cookies->cookies[i];
    while(co) {
      nx = co->next;
      if(co->expires && co->expires < now) {
        if(!pv) {
          cookies->cookies[i] = co->next;
        }
        else {
          pv->next = co->next;
        }
        cookies->numcookies--;
        freecookie(co);
      }
      else {
        pv = co;
      }
      co = nx;
    }
  }
}